

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<cbtOptimizedBvhNode>::copy
          (cbtAlignedObjectArray<cbtOptimizedBvhNode> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long in_RCX;
  int i;
  long lVar11;
  
  lVar10 = (long)(int)dst;
  lVar11 = lVar10 << 6;
  for (; lVar10 < (int)src; lVar10 = lVar10 + 1) {
    puVar1 = (undefined8 *)((long)(this->m_data->m_aabbMinOrg).m_floats + lVar11);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    uVar6 = puVar1[4];
    uVar7 = puVar1[5];
    uVar8 = puVar1[6];
    uVar9 = puVar1[7];
    puVar2 = (undefined8 *)(in_RCX + lVar11);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    puVar2[2] = uVar4;
    puVar2[3] = uVar5;
    puVar2[4] = uVar6;
    puVar2[5] = uVar7;
    puVar2[6] = uVar8;
    puVar2[7] = uVar9;
    lVar11 = lVar11 + 0x40;
  }
  return (int)lVar10;
}

Assistant:

SIMD_FORCE_INLINE void copy(int start, int end, T* dest) const
	{
		int i;
		for (i = start; i < end; ++i)
#ifdef BT_USE_PLACEMENT_NEW
			new (&dest[i]) T(m_data[i]);
#else
			dest[i] = m_data[i];
#endif  //BT_USE_PLACEMENT_NEW
	}